

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_index * index_init_plain(lzma_allocator *allocator)

{
  lzma_index *tree;
  lzma_index *i;
  lzma_allocator *allocator_local;
  
  tree = (lzma_index *)lzma_alloc(0x50,allocator);
  if (tree != (lzma_index *)0x0) {
    index_tree_init((index_tree *)tree);
    tree->uncompressed_size = 0;
    tree->total_size = 0;
    tree->record_count = 0;
    tree->index_list_size = 0;
    tree->prealloc = 0x200;
    tree->checks = 0;
  }
  return tree;
}

Assistant:

static lzma_index *
index_init_plain(const lzma_allocator *allocator)
{
	lzma_index *i = lzma_alloc(sizeof(lzma_index), allocator);
	if (i != NULL) {
		index_tree_init(&i->streams);
		i->uncompressed_size = 0;
		i->total_size = 0;
		i->record_count = 0;
		i->index_list_size = 0;
		i->prealloc = INDEX_GROUP_SIZE;
		i->checks = 0;
	}

	return i;
}